

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int file_gen_utility_names(archive_write *a,file_conflict *file)

{
  file_conflict *pfVar1;
  wchar_t wVar2;
  mode_t mVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  enctype *as;
  void *_p;
  size_t local_b8;
  size_t local_70;
  size_t len2;
  char *rp;
  size_t ll;
  char *pcStack_50;
  int r;
  size_t len;
  char *slash;
  char *dirname;
  char *p;
  char *pp;
  xar_conflict *xar;
  file_conflict *file_local;
  archive_write *a_local;
  
  ll._4_4_ = 0;
  pp = (char *)a->format_data;
  (file->parentdir).length = 0;
  (file->basename).length = 0;
  (file->symlink).length = 0;
  if (file->parent == file) {
    a_local._4_4_ = 0;
  }
  else {
    xar = (xar_conflict *)file;
    file_local = (file_conflict *)a;
    wVar2 = _archive_entry_pathname_l
                      (file->entry,&p,(size_t *)&stack0xffffffffffffffb0,
                       *(archive_string_conv **)(pp + 0x118));
    if (wVar2 != L'\0') {
      piVar4 = __errno_location();
      pfVar1 = file_local;
      if (*piVar4 == 0xc) {
        archive_set_error((archive *)file_local,0xc,"Can\'t allocate memory for Pathname");
        return -0x1e;
      }
      pcVar5 = archive_entry_pathname((archive_entry *)xar->cur_dirent);
      archive_set_error((archive *)pfVar1,0x54,"Can\'t translate pathname \'%s\' to UTF-8",pcVar5);
      ll._4_4_ = -0x14;
    }
    (xar->vstr).buffer_length = 0;
    archive_strncat((archive_string *)&(xar->vstr).length,p,(size_t)pcStack_50);
    pcStack_50 = (char *)(xar->vstr).buffer_length;
    slash = (char *)(xar->vstr).length;
    dirname = slash;
    while (*dirname != '\0') {
      if (*dirname == '/') {
        dirname = dirname + 1;
        pcStack_50 = pcStack_50 + -1;
      }
      else {
        if (*dirname != '.') break;
        if ((dirname[1] == '.') && (dirname[2] == '/')) {
          dirname = dirname + 3;
          pcStack_50 = pcStack_50 + -3;
        }
        else if ((dirname[1] == '/') || ((dirname[1] == '.' && (dirname[2] == '\0')))) {
          dirname = dirname + 2;
          pcStack_50 = pcStack_50 + -2;
        }
        else {
          if (dirname[1] != '\0') break;
          dirname = dirname + 1;
          pcStack_50 = pcStack_50 + -1;
        }
      }
    }
    if (dirname != slash) {
      memmove(slash,dirname,(size_t)(pcStack_50 + 1));
      dirname = slash;
    }
    do {
      pcVar5 = pcStack_50;
      if (pcStack_50 == (char *)0x0) break;
      rp = pcStack_50;
      if (dirname[(long)(pcStack_50 + -1)] == '/') {
        dirname[(long)(pcStack_50 + -1)] = '\0';
        pcStack_50 = pcStack_50 + -1;
      }
      if ((((char *)0x1 < pcStack_50) && (dirname[(long)(pcStack_50 + -2)] == '/')) &&
         (dirname[(long)(pcStack_50 + -1)] == '.')) {
        dirname[(long)(pcStack_50 + -2)] = '\0';
        pcStack_50 = pcStack_50 + -2;
      }
      if ((((char *)0x2 < pcStack_50) && (dirname[(long)(pcStack_50 + -3)] == '/')) &&
         ((dirname[(long)(pcStack_50 + -2)] == '.' && (dirname[(long)(pcStack_50 + -1)] == '.')))) {
        dirname[(long)(pcStack_50 + -3)] = '\0';
        pcStack_50 = pcStack_50 + -3;
      }
    } while (pcVar5 != pcStack_50);
    while (pcVar5 = dirname, *dirname != '\0') {
      if (*dirname == '/') {
        if (dirname[1] == '/') {
          pcVar6 = dirname + 1;
          sVar7 = strlen(dirname + 1);
          memmove(pcVar5,pcVar6,sVar7 + 1);
        }
        else if ((dirname[1] == '.') && (dirname[2] == '/')) {
          pcVar6 = dirname + 2;
          sVar7 = strlen(dirname + 2);
          memmove(pcVar5,pcVar6,sVar7 + 1);
        }
        else if ((dirname[1] == '.') && ((dirname[2] == '.' && (dirname[3] == '/')))) {
          do {
            len2 = (long)pcVar5 - 1;
            if (len2 < slash) break;
            pcVar5 = (char *)len2;
          } while (*(char *)len2 != '/');
          if (slash < len2) {
            strcpy((char *)len2,dirname + 3);
            dirname = (char *)len2;
          }
          else {
            strcpy(slash,dirname + 4);
            dirname = slash;
          }
        }
        else {
          dirname = dirname + 1;
        }
      }
      else {
        dirname = dirname + 1;
      }
    }
    dirname = slash;
    pcStack_50 = (char *)strlen(slash);
    mVar3 = archive_entry_filetype((archive_entry *)xar->cur_dirent);
    if (mVar3 == 0xa000) {
      wVar2 = _archive_entry_symlink_l
                        ((archive_entry *)xar->cur_dirent,&p,&local_70,
                         *(archive_string_conv **)(pp + 0x118));
      if (wVar2 != L'\0') {
        piVar4 = __errno_location();
        pfVar1 = file_local;
        if (*piVar4 == 0xc) {
          archive_set_error((archive *)file_local,0xc,"Can\'t allocate memory for Linkname");
          return -0x1e;
        }
        pcVar5 = archive_entry_symlink((archive_entry *)xar->cur_dirent);
        archive_set_error((archive *)pfVar1,0x54,"Can\'t translate symlink \'%s\' to UTF-8",pcVar5);
        ll._4_4_ = -0x14;
      }
      (xar->a_sumwrk).sha1ctx = (archive_sha1_ctx)0x0;
      archive_strncat((archive_string *)&(xar->a_sumwrk).md5ctx,p,local_70);
    }
    len = 0;
    for (; *dirname != '\0'; dirname = dirname + 1) {
      if (*dirname == '/') {
        len = (size_t)dirname;
      }
    }
    if (len == 0) {
      (xar->vstr).buffer_length = (size_t)pcStack_50;
      *(undefined8 *)&xar->opt_threads = 0;
      archive_string_concat
                ((archive_string *)&xar->opt_compression,(archive_string *)&(xar->vstr).length);
      (xar->vstr).buffer_length = 0;
      *(undefined1 *)(xar->vstr).length = 0;
      a_local._4_4_ = ll._4_4_;
    }
    else {
      *(undefined1 *)len = 0;
      (xar->vstr).buffer_length = len - (long)slash;
      *(undefined8 *)&xar->opt_threads = 0;
      as = &xar->opt_compression;
      _p = (void *)(len + 1);
      if (len == 0xffffffffffffffff) {
        local_b8 = 0;
      }
      else {
        local_b8 = strlen((char *)(len + 1));
      }
      archive_strncat((archive_string *)as,_p,local_b8);
      a_local._4_4_ = ll._4_4_;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
file_gen_utility_names(struct archive_write *a, struct file *file)
{
	struct xar *xar;
	const char *pp;
	char *p, *dirname, *slash;
	size_t len;
	int r = ARCHIVE_OK;

	xar = (struct xar *)a->format_data;
	archive_string_empty(&(file->parentdir));
	archive_string_empty(&(file->basename));
	archive_string_empty(&(file->symlink));

	if (file->parent == file)/* virtual root */
		return (ARCHIVE_OK);

	if (archive_entry_pathname_l(file->entry, &pp, &len, xar->sconv)
	    != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to UTF-8",
		    archive_entry_pathname(file->entry));
		r = ARCHIVE_WARN;
	}
	archive_strncpy(&(file->parentdir), pp, len);
	len = file->parentdir.length;
	p = dirname = file->parentdir.s;
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	cleanup_backslash(p, len);

	/*
	 * Remove leading '/', '../' and './' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else if (p[1] == '/' || (p[1] == '.' && p[2] == '\0')) {
			p += 2;
			len -= 2;
		} else if (p[1] == '\0') {
			p++;
			len--;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				memmove(p, p+1, strlen(p+1) + 1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				memmove(p, p+2, strlen(p+2) + 1);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	if (archive_entry_filetype(file->entry) == AE_IFLNK) {
		size_t len2;
		/* Convert symlink name too. */
		if (archive_entry_symlink_l(file->entry, &pp, &len2,
		    xar->sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate symlink '%s' to UTF-8",
			    archive_entry_symlink(file->entry));
			r = ARCHIVE_WARN;
		}
		archive_strncpy(&(file->symlink), pp, len2);
		cleanup_backslash(file->symlink.s, file->symlink.length);
	}
	/*
	 * - Count up directory elements.
	 * - Find out the position which points the last position of
	 *   path separator('/').
	 */
	slash = NULL;
	for (; *p != '\0'; p++)
		if (*p == '/')
			slash = p;
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (r);
	}

	/* Make a basename from dirname and slash */
	*slash  = '\0';
	file->parentdir.length = slash - dirname;
	archive_strcpy(&(file->basename),  slash + 1);
	return (r);
}